

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86_avx::forward(Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint _c;
  int iVar6;
  uint uVar7;
  _func_int *p_Var8;
  _func_int **pp_Var9;
  int *piVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  int iVar36;
  uint uVar37;
  uint uVar38;
  sbyte sVar39;
  ulong uVar40;
  int unaff_EBP;
  int iVar41;
  float *outptr;
  undefined1 (*pauVar42) [16];
  undefined1 (*pauVar43) [32];
  ulong uVar44;
  size_t sVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 (*pauVar51) [16];
  undefined1 (*pauVar52) [32];
  size_t sVar53;
  ulong uVar54;
  int iVar55;
  long lVar56;
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined8 in_XMM1_Qa;
  undefined8 uVar64;
  __m128 v_03;
  __m128 v_04;
  __m128 v_05;
  __m128 v_06;
  undefined4 local_140;
  Mat m_1;
  Mat m;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined3 uVar32;
  undefined2 uVar34;
  
  p_Var8 = this->_vptr_Padding_x86_avx[-3];
  if (((((*(int *)(&this->field_0xd0 + (long)p_Var8) == 0) &&
        (*(int *)(&this->field_0xd4 + (long)p_Var8) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var8) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var8) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var8) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var8) == 0)) {
    iVar36 = 0;
    if (top_blob != bottom_blob) {
      piVar10 = bottom_blob->refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      piVar10 = top_blob->refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar10 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar10;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar3 = bottom_blob->w;
      iVar4 = bottom_blob->h;
      iVar5 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar3;
      top_blob->h = iVar4;
      top_blob->d = iVar5;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar36 = bottom_blob->elempack;
    if ((iVar36 != 0) && (((int)bottom_blob->elemsize << 3) / iVar36 == 8)) {
      iVar36 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar36;
    }
    iVar3 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    iVar5 = bottom_blob->d;
    _c = bottom_blob->c;
    iVar6 = bottom_blob->dims;
    uVar44 = bottom_blob->elemsize;
    if (iVar36 == 8) {
      if (iVar6 == 1) {
        uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var8) + iVar3 * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var8);
        sVar39 = 3;
        if ((uVar37 & 7) != 0) {
          sVar39 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var8) | uVar37) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0)) {
          uVar38 = uVar37 + 7;
          if (-1 < (int)uVar37) {
            uVar38 = uVar37;
          }
          Mat::create(top_blob,(int)uVar38 >> 3,(uVar44 >> 3) << sVar39,8,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar46 = *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar49 = *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar48 = iVar46 + 7;
              if (-1 < iVar46) {
                iVar48 = iVar46;
              }
              iVar46 = iVar49 + 7;
              if (-1 < iVar49) {
                iVar46 = iVar49;
              }
              v_01[2] = (float)local_140;
              v_01._0_8_ = this;
              v_01[3] = 1.4013e-45;
              v_01._16_8_ = m_1.data;
              v_01[6] = (float)m_1.refcount._0_4_;
              v_01[7] = m_1.refcount._4_4_;
              padding_constant_pack8_avx(bottom_blob,top_blob,0,0,iVar48 >> 3,iVar46 >> 3,v_01);
              unaff_EBP = 0;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar6 == 2) {
        p_Var8 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xd0 + (long)p_Var8) + iVar4 * 8 +
                 *(int *)(&this->field_0xd4 + (long)p_Var8);
        sVar39 = 3;
        if ((uVar37 & 7) != 0) {
          sVar39 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd0 + (long)p_Var8) | uVar37) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0)) {
          uVar38 = uVar37 + 7;
          if (-1 < (int)uVar37) {
            uVar38 = uVar37;
          }
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var8) + iVar3 +
                               *(int *)(&this->field_0xdc + (long)p_Var8),(int)uVar38 >> 3,
                      (uVar44 >> 3) << sVar39,8,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var8 = this->_vptr_Padding_x86_avx[-3];
              iVar46 = *(int *)(&this->field_0xd0 + (long)p_Var8);
              iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              iVar48 = iVar46 + 7;
              if (-1 < iVar46) {
                iVar48 = iVar46;
              }
              iVar46 = iVar49 + 7;
              if (-1 < iVar49) {
                iVar46 = iVar49;
              }
              v_02[2] = (float)local_140;
              v_02._0_8_ = this;
              v_02[3] = 2.8026e-45;
              v_02._16_8_ = m_1.data;
              v_02[6] = (float)m_1.refcount._0_4_;
              v_02[7] = m_1.refcount._4_4_;
              padding_constant_pack8_avx
                        (bottom_blob,top_blob,iVar48 >> 3,iVar46 >> 3,
                         *(int *)(&this->field_0xd8 + (long)p_Var8),
                         *(int *)(&this->field_0xdc + (long)p_Var8),v_02);
              unaff_EBP = 0;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar6 == 3) {
        p_Var8 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xe8 + (long)p_Var8) + _c * 8 +
                 *(int *)(&this->field_0xec + (long)p_Var8);
        sVar39 = 3;
        if ((uVar37 & 7) != 0) {
          sVar39 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var8) | uVar37) & 7) == 0) {
          if ((uVar37 == _c * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0)) {
            uVar38 = uVar37 + 7;
            if (-1 < (int)uVar37) {
              uVar38 = uVar37;
            }
            Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var8) + iVar3 +
                                 *(int *)(&this->field_0xdc + (long)p_Var8),
                        *(int *)(&this->field_0xd0 + (long)p_Var8) + iVar4 +
                        *(int *)(&this->field_0xd4 + (long)p_Var8),(int)uVar38 >> 3,
                        (uVar44 >> 3) << sVar39,8,opt->blob_allocator);
            unaff_EBP = -100;
            if (top_blob->data == (void *)0x0) {
              bVar11 = false;
            }
            else {
              bVar11 = false;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar46 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
                iVar49 = iVar46 + 7;
                if (-1 < iVar46) {
                  iVar49 = iVar46;
                }
                if (7 < (int)uVar37) {
                  uVar54 = 0;
                  do {
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    uVar57 = top_blob->elemsize;
                    pauVar43 = (undefined1 (*) [32])
                               (top_blob->cstep * uVar54 * uVar57 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)uVar57;
                    m.elemsize._4_4_ = (undefined4)(uVar57 >> 0x20);
                    m.d = 1;
                    sVar45 = (long)m.h * (long)top_blob->w;
                    m.w = top_blob->w;
                    m.dims = top_blob->dims + -1;
                    m.cstep = (uVar57 * sVar45 + 0xf & 0xfffffffffffffff0) / uVar57;
                    if (top_blob->dims == 4) {
                      m.cstep = sVar45;
                    }
                    p_Var8 = this->_vptr_Padding_x86_avx[-3];
                    if (*(int *)(&this->field_0xf0 + (long)p_Var8) == 0) {
                      uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
                      auVar62._4_4_ = uVar2;
                      auVar62._0_4_ = uVar2;
                      auVar62._8_4_ = uVar2;
                      auVar62._12_4_ = uVar2;
                      auVar62._16_4_ = uVar2;
                      auVar62._20_4_ = uVar2;
                      auVar62._24_4_ = uVar2;
                      auVar62._28_4_ = uVar2;
                    }
                    else {
                      auVar62 = *(undefined1 (*) [32])
                                 (*(long *)(&this->field_0xf8 + (long)p_Var8) + uVar54 * 0x20);
                    }
                    uVar37 = -(iVar49 >> 3) + (int)uVar54;
                    m.data = pauVar43;
                    if ((int)uVar37 < 0 || (int)_c <= (int)uVar37) {
                      iVar46 = m.c * (int)m.cstep;
                      if (0 < iVar46) {
                        do {
                          *pauVar43 = auVar62;
                          pauVar43 = pauVar43 + 1;
                          iVar46 = iVar46 + -1;
                        } while (iVar46 != 0);
                      }
                    }
                    else {
                      m_1.w = bottom_blob->w;
                      m_1.h = bottom_blob->h;
                      m_1.c = bottom_blob->d;
                      uVar57 = bottom_blob->elemsize;
                      pauVar59 = (undefined1 (*) [32])
                                 ((ulong)uVar37 * bottom_blob->cstep * uVar57 +
                                 (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = (undefined4)uVar57;
                      m_1.elemsize._4_4_ = (undefined4)(uVar57 >> 0x20);
                      m_1.d = 1;
                      m_1.dims = bottom_blob->dims + -1;
                      m_1.cstep = (uVar57 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                                  uVar57;
                      if (bottom_blob->dims == 4) {
                        m_1.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      p_Var8 = this->_vptr_Padding_x86_avx[-3];
                      m_1.data = pauVar59;
                      if (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0) {
                        v[2] = (float)-(iVar49 >> 3);
                        v._0_8_ = this;
                        v[3] = 4.2039e-45;
                        v._16_8_ = pauVar59;
                        v[6] = 0.0;
                        v[7] = 0.0;
                        padding_constant_pack8_avx
                                  (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var8),
                                   *(int *)(&this->field_0xd4 + (long)p_Var8),
                                   *(int *)(&this->field_0xd8 + (long)p_Var8),
                                   *(int *)(&this->field_0xdc + (long)p_Var8),v);
                      }
                      pp_Var9 = this->_vptr_Padding_x86_avx;
                      p_Var8 = pp_Var9[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var8) == 1) {
                        iVar46 = *(int *)(&this->field_0xd0 + (long)p_Var8);
                        iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                        iVar55 = *(int *)(&this->field_0xd8 + (long)p_Var8);
                        iVar41 = *(int *)(&this->field_0xdc + (long)p_Var8);
                        if (0 < iVar46) {
                          iVar47 = 0;
                          do {
                            auVar62 = *pauVar59;
                            iVar50 = iVar55;
                            if (0 < iVar55) {
                              do {
                                *pauVar43 = auVar62;
                                pauVar43 = pauVar43 + 1;
                                iVar50 = iVar50 + -1;
                              } while (iVar50 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar50 = 0;
                              pauVar52 = pauVar59;
                              do {
                                auVar62 = *pauVar52;
                                *pauVar43 = auVar62;
                                pauVar52 = pauVar52 + 1;
                                pauVar43 = pauVar43 + 1;
                                iVar50 = iVar50 + 1;
                              } while (iVar50 < m_1.w);
                            }
                            iVar50 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *pauVar43 = auVar62;
                                pauVar43 = pauVar43 + 1;
                                iVar50 = iVar50 + -1;
                              } while (iVar50 != 0);
                            }
                            iVar47 = iVar47 + 1;
                          } while (iVar47 != iVar46);
                        }
                        if (0 < m_1.h) {
                          iVar46 = 0;
                          do {
                            auVar62 = *pauVar59;
                            iVar47 = iVar55;
                            if (0 < iVar55) {
                              do {
                                *pauVar43 = auVar62;
                                pauVar43 = pauVar43 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar47 = 0;
                              do {
                                auVar62 = *pauVar59;
                                *pauVar43 = auVar62;
                                pauVar59 = pauVar59 + 1;
                                pauVar43 = pauVar43 + 1;
                                iVar47 = iVar47 + 1;
                              } while (iVar47 < m_1.w);
                            }
                            iVar47 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *pauVar43 = auVar62;
                                pauVar43 = pauVar43 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            iVar46 = iVar46 + 1;
                          } while (iVar46 < m_1.h);
                        }
                        if (0 < iVar48) {
                          iVar46 = 0;
                          do {
                            auVar62 = pauVar59[-(long)m_1.w];
                            iVar47 = iVar55;
                            if (0 < iVar55) {
                              do {
                                *pauVar43 = auVar62;
                                pauVar43 = pauVar43 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar47 = 0;
                              pauVar52 = pauVar59 + -(long)m_1.w;
                              do {
                                auVar62 = *pauVar52;
                                *pauVar43 = auVar62;
                                pauVar52 = pauVar52 + 1;
                                pauVar43 = pauVar43 + 1;
                                iVar47 = iVar47 + 1;
                              } while (iVar47 < m_1.w);
                            }
                            iVar47 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *pauVar43 = auVar62;
                                pauVar43 = pauVar43 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            iVar46 = iVar46 + 1;
                          } while (iVar46 != iVar48);
                        }
                      }
                      p_Var8 = pp_Var9[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var8) == 2) {
                        iVar46 = *(int *)(&this->field_0xd0 + (long)p_Var8);
                        iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                        uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var8);
                        uVar57 = (ulong)uVar37;
                        uVar7 = *(uint *)(&this->field_0xdc + (long)p_Var8);
                        uVar40 = (ulong)uVar7;
                        pauVar59 = (undefined1 (*) [32])
                                   ((long)(m_1.w * iVar46 * 8) * 4 + (long)m_1.data);
                        pauVar43 = (undefined1 (*) [32])m.data;
                        if (0 < iVar46) {
                          iVar55 = 0;
                          do {
                            lVar56 = uVar57 << 5;
                            if (0 < (int)uVar37) {
                              do {
                                *pauVar43 = *(undefined1 (*) [32])(*pauVar59 + lVar56);
                                pauVar43 = pauVar43 + 1;
                                lVar56 = lVar56 + -0x20;
                              } while (lVar56 != 0);
                            }
                            pauVar52 = pauVar59;
                            if (0 < m_1.w) {
                              iVar41 = 0;
                              do {
                                *pauVar43 = *pauVar52;
                                pauVar52 = pauVar52 + 1;
                                pauVar43 = pauVar43 + 1;
                                iVar41 = iVar41 + 1;
                              } while (iVar41 < m_1.w);
                            }
                            if (0 < (int)uVar7) {
                              lVar56 = -0x40;
                              do {
                                *pauVar43 = *(undefined1 (*) [32])(*pauVar52 + lVar56);
                                pauVar43 = pauVar43 + 1;
                                lVar1 = uVar40 * 0x20 + lVar56;
                                lVar56 = lVar56 + -0x20;
                              } while (lVar1 != -0x20);
                            }
                            pauVar59 = pauVar59 + -(long)m_1.w;
                            iVar55 = iVar55 + 1;
                          } while (iVar55 != iVar46);
                        }
                        if (0 < m_1.h) {
                          iVar46 = 0;
                          do {
                            lVar56 = uVar57 << 5;
                            if (0 < (int)uVar37) {
                              do {
                                *pauVar43 = *(undefined1 (*) [32])(*pauVar59 + lVar56);
                                pauVar43 = pauVar43 + 1;
                                lVar56 = lVar56 + -0x20;
                              } while (lVar56 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar55 = 0;
                              do {
                                *pauVar43 = *pauVar59;
                                pauVar59 = pauVar59 + 1;
                                pauVar43 = pauVar43 + 1;
                                iVar55 = iVar55 + 1;
                              } while (iVar55 < m_1.w);
                            }
                            if (0 < (int)uVar7) {
                              lVar56 = -0x40;
                              do {
                                *pauVar43 = *(undefined1 (*) [32])(*pauVar59 + lVar56);
                                pauVar43 = pauVar43 + 1;
                                lVar1 = uVar40 * 0x20 + lVar56;
                                lVar56 = lVar56 + -0x20;
                              } while (lVar1 != -0x20);
                            }
                            iVar46 = iVar46 + 1;
                          } while (iVar46 < m_1.h);
                        }
                        if (0 < iVar48) {
                          pauVar59 = pauVar59 + (long)m_1.w * -2;
                          iVar46 = 0;
                          do {
                            lVar56 = uVar57 << 5;
                            if (0 < (int)uVar37) {
                              do {
                                *pauVar43 = *(undefined1 (*) [32])(*pauVar59 + lVar56);
                                pauVar43 = pauVar43 + 1;
                                lVar56 = lVar56 + -0x20;
                              } while (lVar56 != 0);
                            }
                            pauVar52 = pauVar59;
                            if (0 < m_1.w) {
                              iVar55 = 0;
                              do {
                                *pauVar43 = *pauVar52;
                                pauVar52 = pauVar52 + 1;
                                pauVar43 = pauVar43 + 1;
                                iVar55 = iVar55 + 1;
                              } while (iVar55 < m_1.w);
                            }
                            if (0 < (int)uVar7) {
                              lVar56 = -0x40;
                              do {
                                *pauVar43 = *(undefined1 (*) [32])(*pauVar52 + lVar56);
                                pauVar43 = pauVar43 + 1;
                                lVar1 = uVar40 * 0x20 + lVar56;
                                lVar56 = lVar56 + -0x20;
                              } while (lVar1 != -0x20);
                            }
                            pauVar59 = pauVar59 + -(long)m_1.w;
                            iVar46 = iVar46 + 1;
                          } while (iVar46 != iVar48);
                        }
                      }
                      piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                    }
                    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != (uint)((int)uVar38 >> 3));
                }
                bVar11 = false;
                unaff_EBP = 0;
              }
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar6 == 4) {
        p_Var8 = this->_vptr_Padding_x86_avx[-3];
        iVar46 = *(int *)(&this->field_0xe0 + (long)p_Var8);
        if (iVar46 == 0) {
          uVar37 = *(int *)(&this->field_0xe8 + (long)p_Var8) + iVar5 +
                   *(int *)(&this->field_0xec + (long)p_Var8);
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var8) + iVar3 +
                               *(int *)(&this->field_0xdc + (long)p_Var8),
                      *(int *)(&this->field_0xd0 + (long)p_Var8) + iVar4 +
                      *(int *)(&this->field_0xd4 + (long)p_Var8),uVar37,_c,uVar44,8,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)_c < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar54 = 0;
              do {
                p_Var8 = this->_vptr_Padding_x86_avx[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var8) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
                  auVar63._4_4_ = uVar2;
                  auVar63._0_4_ = uVar2;
                  auVar63._8_4_ = uVar2;
                  auVar63._12_4_ = uVar2;
                  auVar63._16_4_ = uVar2;
                  auVar63._20_4_ = uVar2;
                  auVar63._24_4_ = uVar2;
                  auVar63._28_4_ = uVar2;
                }
                else {
                  auVar63 = *(undefined1 (*) [32])
                             (*(long *)(&this->field_0xf8 + (long)p_Var8) + uVar54 * 0x20);
                }
                if (0 < (int)uVar37) {
                  uVar57 = 0;
                  do {
                    sVar45 = top_blob->elemsize;
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    sVar53 = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar57 * sVar45 * sVar53 + top_blob->cstep * uVar54 * sVar45);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar45;
                    m.elemsize._4_4_ = (undefined4)(sVar45 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    uVar38 = (int)uVar57 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
                    if ((int)uVar38 < 0 || iVar5 <= (int)uVar38) {
                      m.cstep._0_4_ = (int)sVar53;
                      pauVar43 = (undefined1 (*) [32])m.data;
                      if (0 < (int)m.cstep) {
                        do {
                          *pauVar43 = auVar63;
                          m.cstep._0_4_ = (int)m.cstep + -1;
                          pauVar43 = pauVar43 + 1;
                        } while ((int)m.cstep != 0);
                      }
                    }
                    else {
                      m_1.h = bottom_blob->h;
                      sVar45 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar45 * (ulong)uVar38 +
                                         bottom_blob->cstep * uVar54 * sVar45);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = (undefined4)sVar45;
                      m_1.elemsize._4_4_ = (undefined4)(sVar45 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var8 = this->_vptr_Padding_x86_avx[-3];
                      v_00[2] = (float)uVar37;
                      v_00._0_8_ = this;
                      v_00[3] = 5.60519e-45;
                      v_00._16_8_ = m_1.data;
                      v_00[6] = 0.0;
                      v_00[7] = 0.0;
                      m.cstep = sVar53;
                      padding_constant_pack8_avx
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var8),
                                 *(int *)(&this->field_0xd4 + (long)p_Var8),
                                 *(int *)(&this->field_0xd8 + (long)p_Var8),
                                 *(int *)(&this->field_0xdc + (long)p_Var8),v_00);
                      piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      sVar53 = m.cstep;
                    }
                    m.cstep = sVar53;
                    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar37);
                }
                uVar54 = uVar54 + 1;
              } while (uVar54 != _c);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar46 == 0) {
          return unaff_EBP;
        }
      }
    }
    if (iVar36 == 4) {
      if (iVar6 == 1) {
        p_Var8 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var8) + iVar3 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var8);
        sVar39 = 3;
        if ((uVar37 & 7) != 0) {
          sVar39 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var8) & 3) == 0) && ((uVar37 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0)) {
          Mat::create(top_blob,(int)uVar37 >> 2,(uVar44 >> 2) << sVar39,4,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var8 = this->_vptr_Padding_x86_avx[-3];
              v_04[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
              v_04[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
              iVar46 = *(int *)(&this->field_0xd8 + (long)p_Var8);
              iVar49 = *(int *)(&this->field_0xdc + (long)p_Var8);
              iVar48 = iVar46 + 3;
              if (-1 < iVar46) {
                iVar48 = iVar46;
              }
              iVar46 = iVar49 + 3;
              if (-1 < iVar49) {
                iVar46 = iVar49;
              }
              v_04[2] = (float)(int)in_XMM1_Qa;
              v_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
              padding_constant_pack4_sse(bottom_blob,top_blob,0,0,iVar48 >> 2,iVar46 >> 2,v_04);
              unaff_EBP = 0;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar6 == 2) {
        p_Var8 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xd0 + (long)p_Var8) + iVar4 * 4 +
                 *(int *)(&this->field_0xd4 + (long)p_Var8);
        sVar39 = 3;
        if ((uVar37 & 7) != 0) {
          sVar39 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if ((((*(uint *)(&this->field_0xd0 + (long)p_Var8) & 3) == 0) && ((uVar37 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0)) {
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var8) + iVar3 +
                               *(int *)(&this->field_0xdc + (long)p_Var8),(int)uVar37 >> 2,
                      (uVar44 >> 2) << sVar39,4,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var8 = this->_vptr_Padding_x86_avx[-3];
              iVar46 = *(int *)(&this->field_0xd0 + (long)p_Var8);
              iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              iVar48 = iVar46 + 3;
              if (-1 < iVar46) {
                iVar48 = iVar46;
              }
              iVar46 = iVar49 + 3;
              if (-1 < iVar49) {
                iVar46 = iVar49;
              }
              v_05[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
              v_05[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
              v_05[2] = (float)(int)in_XMM1_Qa;
              v_05[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
              padding_constant_pack4_sse
                        (bottom_blob,top_blob,iVar48 >> 2,iVar46 >> 2,
                         *(int *)(&this->field_0xd8 + (long)p_Var8),
                         *(int *)(&this->field_0xdc + (long)p_Var8),v_05);
              unaff_EBP = 0;
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar6 == 3) {
        p_Var8 = this->_vptr_Padding_x86_avx[-3];
        uVar37 = *(uint *)(&this->field_0xe8 + (long)p_Var8) + _c * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var8);
        sVar39 = 3;
        if ((uVar37 & 7) != 0) {
          sVar39 = ((uVar37 & 3) == 0) * '\x02';
        }
        bVar11 = true;
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var8) & 3) == 0) && ((uVar37 & 7) == 4)) {
          if ((uVar37 == _c * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0)) {
            uVar37 = (int)uVar37 >> 2;
            Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var8) + iVar3 +
                                 *(int *)(&this->field_0xdc + (long)p_Var8),
                        *(int *)(&this->field_0xd0 + (long)p_Var8) + iVar4 +
                        *(int *)(&this->field_0xd4 + (long)p_Var8),uVar37,(uVar44 >> 2) << sVar39,4,
                        opt->blob_allocator);
            unaff_EBP = -100;
            if (top_blob->data == (void *)0x0) {
              bVar11 = false;
            }
            else {
              bVar11 = false;
              if ((long)top_blob->c * top_blob->cstep != 0) {
                iVar46 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
                iVar49 = iVar46 + 3;
                if (-1 < iVar46) {
                  iVar49 = iVar46;
                }
                if (0 < (int)uVar37) {
                  uVar54 = 0;
                  do {
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    uVar57 = top_blob->elemsize;
                    pauVar42 = (undefined1 (*) [16])
                               (top_blob->cstep * uVar54 * uVar57 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)uVar57;
                    m.elemsize._4_4_ = (undefined4)(uVar57 >> 0x20);
                    m.d = 1;
                    sVar45 = (long)m.h * (long)top_blob->w;
                    m.w = top_blob->w;
                    m.dims = top_blob->dims + -1;
                    m.cstep = (uVar57 * sVar45 + 0xf & 0xfffffffffffffff0) / uVar57;
                    if (top_blob->dims == 4) {
                      m.cstep = sVar45;
                    }
                    p_Var8 = this->_vptr_Padding_x86_avx[-3];
                    if (*(int *)(&this->field_0xf0 + (long)p_Var8) == 0) {
                      uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
                      auVar60._4_4_ = uVar2;
                      auVar60._0_4_ = uVar2;
                      auVar60._8_4_ = uVar2;
                      auVar60._12_4_ = uVar2;
                    }
                    else {
                      auVar60 = *(undefined1 (*) [16])
                                 (*(long *)(&this->field_0xf8 + (long)p_Var8) + uVar54 * 0x10);
                    }
                    uVar38 = (int)uVar54 - (iVar49 >> 2);
                    m.data = pauVar42;
                    if ((int)uVar38 < 0 || (int)_c <= (int)uVar38) {
                      iVar46 = m.c * (int)m.cstep;
                      if (0 < iVar46) {
                        do {
                          *pauVar42 = auVar60;
                          pauVar42 = pauVar42 + 1;
                          iVar46 = iVar46 + -1;
                        } while (iVar46 != 0);
                      }
                    }
                    else {
                      m_1.w = bottom_blob->w;
                      m_1.h = bottom_blob->h;
                      m_1.c = bottom_blob->d;
                      uVar57 = bottom_blob->elemsize;
                      pauVar58 = (undefined1 (*) [16])
                                 ((ulong)uVar38 * bottom_blob->cstep * uVar57 +
                                 (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = (undefined4)uVar57;
                      m_1.elemsize._4_4_ = (undefined4)(uVar57 >> 0x20);
                      m_1.d = 1;
                      m_1.dims = bottom_blob->dims + -1;
                      m_1.cstep = (uVar57 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                                  uVar57;
                      if (bottom_blob->dims == 4) {
                        m_1.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      p_Var8 = this->_vptr_Padding_x86_avx[-3];
                      m_1.data = pauVar58;
                      if (*(int *)(&this->field_0xe0 + (long)p_Var8) == 0) {
                        v_03._0_8_ = auVar60._0_8_;
                        v_03[2] = 0.0;
                        v_03[3] = 0.0;
                        padding_constant_pack4_sse
                                  (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var8),
                                   *(int *)(&this->field_0xd4 + (long)p_Var8),
                                   *(int *)(&this->field_0xd8 + (long)p_Var8),
                                   *(int *)(&this->field_0xdc + (long)p_Var8),v_03);
                      }
                      pp_Var9 = this->_vptr_Padding_x86_avx;
                      p_Var8 = pp_Var9[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var8) == 1) {
                        iVar46 = *(int *)(&this->field_0xd0 + (long)p_Var8);
                        iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                        iVar55 = *(int *)(&this->field_0xd8 + (long)p_Var8);
                        iVar41 = *(int *)(&this->field_0xdc + (long)p_Var8);
                        if (0 < iVar46) {
                          iVar47 = 0;
                          do {
                            auVar60 = *pauVar58;
                            iVar50 = iVar55;
                            if (0 < iVar55) {
                              do {
                                *pauVar42 = auVar60;
                                pauVar42 = pauVar42 + 1;
                                iVar50 = iVar50 + -1;
                              } while (iVar50 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar50 = 0;
                              pauVar51 = pauVar58;
                              do {
                                auVar60 = *pauVar51;
                                *pauVar42 = auVar60;
                                pauVar51 = pauVar51 + 1;
                                pauVar42 = pauVar42 + 1;
                                iVar50 = iVar50 + 1;
                              } while (iVar50 < m_1.w);
                            }
                            iVar50 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *pauVar42 = auVar60;
                                pauVar42 = pauVar42 + 1;
                                iVar50 = iVar50 + -1;
                              } while (iVar50 != 0);
                            }
                            iVar47 = iVar47 + 1;
                          } while (iVar47 != iVar46);
                        }
                        if (0 < m_1.h) {
                          iVar46 = 0;
                          do {
                            auVar60 = *pauVar58;
                            iVar47 = iVar55;
                            if (0 < iVar55) {
                              do {
                                *pauVar42 = auVar60;
                                pauVar42 = pauVar42 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar47 = 0;
                              do {
                                auVar60 = *pauVar58;
                                *pauVar42 = auVar60;
                                pauVar58 = pauVar58 + 1;
                                pauVar42 = pauVar42 + 1;
                                iVar47 = iVar47 + 1;
                              } while (iVar47 < m_1.w);
                            }
                            iVar47 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *pauVar42 = auVar60;
                                pauVar42 = pauVar42 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            iVar46 = iVar46 + 1;
                          } while (iVar46 < m_1.h);
                        }
                        if (0 < iVar48) {
                          iVar46 = 0;
                          do {
                            auVar60 = pauVar58[-(long)m_1.w];
                            iVar47 = iVar55;
                            if (0 < iVar55) {
                              do {
                                *pauVar42 = auVar60;
                                pauVar42 = pauVar42 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar47 = 0;
                              pauVar51 = pauVar58 + -(long)m_1.w;
                              do {
                                auVar60 = *pauVar51;
                                *pauVar42 = auVar60;
                                pauVar51 = pauVar51 + 1;
                                pauVar42 = pauVar42 + 1;
                                iVar47 = iVar47 + 1;
                              } while (iVar47 < m_1.w);
                            }
                            iVar47 = iVar41;
                            if (0 < iVar41) {
                              do {
                                *pauVar42 = auVar60;
                                pauVar42 = pauVar42 + 1;
                                iVar47 = iVar47 + -1;
                              } while (iVar47 != 0);
                            }
                            iVar46 = iVar46 + 1;
                          } while (iVar46 != iVar48);
                        }
                      }
                      p_Var8 = pp_Var9[-3];
                      if (*(int *)(&this->field_0xe0 + (long)p_Var8) == 2) {
                        iVar46 = *(int *)(&this->field_0xd0 + (long)p_Var8);
                        iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                        uVar38 = *(uint *)(&this->field_0xd8 + (long)p_Var8);
                        uVar57 = (ulong)uVar38;
                        uVar7 = *(uint *)(&this->field_0xdc + (long)p_Var8);
                        uVar40 = (ulong)uVar7;
                        pauVar58 = (undefined1 (*) [16])
                                   ((long)(m_1.w * iVar46 * 4) * 4 + (long)m_1.data);
                        pauVar42 = (undefined1 (*) [16])m.data;
                        if (0 < iVar46) {
                          iVar55 = 0;
                          do {
                            lVar56 = uVar57 << 4;
                            if (0 < (int)uVar38) {
                              do {
                                *pauVar42 = *(undefined1 (*) [16])(*pauVar58 + lVar56);
                                pauVar42 = pauVar42 + 1;
                                lVar56 = lVar56 + -0x10;
                              } while (lVar56 != 0);
                            }
                            pauVar51 = pauVar58;
                            if (0 < m_1.w) {
                              iVar41 = 0;
                              do {
                                *pauVar42 = *pauVar51;
                                pauVar51 = pauVar51 + 1;
                                pauVar42 = pauVar42 + 1;
                                iVar41 = iVar41 + 1;
                              } while (iVar41 < m_1.w);
                            }
                            if (0 < (int)uVar7) {
                              lVar56 = -0x20;
                              do {
                                *pauVar42 = *(undefined1 (*) [16])(*pauVar51 + lVar56);
                                pauVar42 = pauVar42 + 1;
                                lVar1 = uVar40 * 0x10 + lVar56;
                                lVar56 = lVar56 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            pauVar58 = pauVar58 + -(long)m_1.w;
                            iVar55 = iVar55 + 1;
                          } while (iVar55 != iVar46);
                        }
                        if (0 < m_1.h) {
                          iVar46 = 0;
                          do {
                            lVar56 = uVar57 << 4;
                            if (0 < (int)uVar38) {
                              do {
                                *pauVar42 = *(undefined1 (*) [16])(*pauVar58 + lVar56);
                                pauVar42 = pauVar42 + 1;
                                lVar56 = lVar56 + -0x10;
                              } while (lVar56 != 0);
                            }
                            if (0 < m_1.w) {
                              iVar55 = 0;
                              do {
                                *pauVar42 = *pauVar58;
                                pauVar58 = pauVar58 + 1;
                                pauVar42 = pauVar42 + 1;
                                iVar55 = iVar55 + 1;
                              } while (iVar55 < m_1.w);
                            }
                            if (0 < (int)uVar7) {
                              lVar56 = -0x20;
                              do {
                                *pauVar42 = *(undefined1 (*) [16])(*pauVar58 + lVar56);
                                pauVar42 = pauVar42 + 1;
                                lVar1 = uVar40 * 0x10 + lVar56;
                                lVar56 = lVar56 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            iVar46 = iVar46 + 1;
                          } while (iVar46 < m_1.h);
                        }
                        if (0 < iVar48) {
                          pauVar58 = pauVar58 + (long)m_1.w * -2;
                          iVar46 = 0;
                          do {
                            lVar56 = uVar57 << 4;
                            if (0 < (int)uVar38) {
                              do {
                                *pauVar42 = *(undefined1 (*) [16])(*pauVar58 + lVar56);
                                pauVar42 = pauVar42 + 1;
                                lVar56 = lVar56 + -0x10;
                              } while (lVar56 != 0);
                            }
                            pauVar51 = pauVar58;
                            if (0 < m_1.w) {
                              iVar55 = 0;
                              do {
                                *pauVar42 = *pauVar51;
                                pauVar51 = pauVar51 + 1;
                                pauVar42 = pauVar42 + 1;
                                iVar55 = iVar55 + 1;
                              } while (iVar55 < m_1.w);
                            }
                            if (0 < (int)uVar7) {
                              lVar56 = -0x20;
                              do {
                                *pauVar42 = *(undefined1 (*) [16])(*pauVar51 + lVar56);
                                pauVar42 = pauVar42 + 1;
                                lVar1 = uVar40 * 0x10 + lVar56;
                                lVar56 = lVar56 + -0x10;
                              } while (lVar1 != -0x10);
                            }
                            pauVar58 = pauVar58 + -(long)m_1.w;
                            iVar46 = iVar46 + 1;
                          } while (iVar46 != iVar48);
                        }
                      }
                      piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                    }
                    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    in_XMM1_Qa = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar37);
                }
                bVar11 = false;
                unaff_EBP = 0;
              }
            }
          }
        }
        if (!bVar11) {
          return unaff_EBP;
        }
      }
      if (iVar6 == 4) {
        p_Var8 = this->_vptr_Padding_x86_avx[-3];
        iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var8);
        if (iVar6 == 0) {
          uVar37 = *(int *)(&this->field_0xe8 + (long)p_Var8) + iVar5 +
                   *(int *)(&this->field_0xec + (long)p_Var8);
          Mat::create(top_blob,iVar3 + *(int *)(&this->field_0xd8 + (long)p_Var8) +
                               *(int *)(&this->field_0xdc + (long)p_Var8),
                      iVar4 + *(int *)(&this->field_0xd0 + (long)p_Var8) +
                      *(int *)(&this->field_0xd4 + (long)p_Var8),uVar37,_c,uVar44,4,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)_c < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar44 = 0;
              do {
                p_Var8 = this->_vptr_Padding_x86_avx[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var8) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var8);
                  auVar61._4_4_ = uVar2;
                  auVar61._0_4_ = uVar2;
                  auVar61._8_4_ = uVar2;
                  auVar61._12_4_ = uVar2;
                }
                else {
                  auVar61 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var8) + uVar44 * 0x10);
                }
                uVar64 = in_XMM1_Qa;
                if (0 < (int)uVar37) {
                  uVar54 = 0;
                  do {
                    sVar45 = top_blob->elemsize;
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    sVar53 = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar54 * sVar45 * sVar53 + top_blob->cstep * uVar44 * sVar45);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar45;
                    m.elemsize._4_4_ = (undefined4)(sVar45 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    uVar38 = (int)uVar54 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
                    if ((int)uVar38 < 0 || iVar5 <= (int)uVar38) {
                      m.cstep._0_4_ = (int)sVar53;
                      pauVar42 = (undefined1 (*) [16])m.data;
                      if (0 < (int)m.cstep) {
                        do {
                          *pauVar42 = auVar61;
                          m.cstep._0_4_ = (int)m.cstep + -1;
                          pauVar42 = pauVar42 + 1;
                        } while ((int)m.cstep != 0);
                      }
                    }
                    else {
                      m_1.h = bottom_blob->h;
                      sVar45 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar45 * (ulong)uVar38 +
                                         bottom_blob->cstep * uVar44 * sVar45);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = (undefined4)sVar45;
                      m_1.elemsize._4_4_ = (undefined4)(sVar45 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var8 = this->_vptr_Padding_x86_avx[-3];
                      v_06._0_8_ = auVar61._0_8_;
                      v_06[2] = (float)(int)in_XMM1_Qa;
                      v_06[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                      m.cstep = sVar53;
                      padding_constant_pack4_sse
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var8),
                                 *(int *)(&this->field_0xd4 + (long)p_Var8),
                                 *(int *)(&this->field_0xd8 + (long)p_Var8),
                                 *(int *)(&this->field_0xdc + (long)p_Var8),v_06);
                      piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar10 != (int *)0x0) {
                        LOCK();
                        *piVar10 = *piVar10 + -1;
                        UNLOCK();
                        if (*piVar10 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0.0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                      sVar53 = m.cstep;
                    }
                    m.cstep = sVar53;
                    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    in_XMM1_Qa = 0;
                    uVar64 = 0;
                    uVar54 = uVar54 + 1;
                  } while (uVar54 != uVar37);
                }
                uVar44 = uVar44 + 1;
                in_XMM1_Qa = uVar64;
              } while (uVar44 != _c);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar6 == 0) {
          return unaff_EBP;
        }
      }
    }
    piVar10 = bottom_blob->refcount;
    m.data = bottom_blob->data;
    m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
    m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
    m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.dims = bottom_blob->dims;
    m.w = bottom_blob->w;
    uVar12 = bottom_blob->h;
    uVar13 = bottom_blob->d;
    m.c = bottom_blob->c;
    m.cstep = bottom_blob->cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    m.h = uVar12;
    m.d = uVar13;
    if (iVar36 != 1) {
      m_1.data = *(void **)opt;
      uVar14 = opt->openmp_blocktime;
      uVar15 = opt->use_winograd_convolution;
      uVar17 = opt->use_sgemm_convolution;
      uVar19 = opt->use_int8_inference;
      uVar21 = opt->use_vulkan_compute;
      uVar20 = CONCAT11(uVar21,uVar19);
      uVar18 = CONCAT21(uVar20,uVar17);
      uVar16 = CONCAT31(uVar18,uVar15);
      m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
      m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      uVar22 = opt->flush_denormals;
      uVar23 = opt->use_local_pool_allocator;
      uVar25 = opt->use_shader_local_memory;
      uVar27 = opt->use_cooperative_matrix;
      uVar29 = opt->use_winograd23_convolution;
      uVar28 = CONCAT11(uVar29,uVar27);
      uVar26 = CONCAT21(uVar28,uVar25);
      uVar24 = CONCAT31(uVar26,uVar23);
      uVar64._0_1_ = opt->use_winograd43_convolution;
      uVar64._1_1_ = opt->use_winograd63_convolution;
      uVar64._2_1_ = opt->use_a53_a55_optimized_kernel;
      uVar64._3_1_ = opt->use_reserved_7;
      uVar30 = opt->use_reserved_8;
      uVar31 = opt->use_reserved_9;
      uVar33 = opt->use_reserved_10;
      uVar35 = opt->use_reserved_11;
      uVar34 = CONCAT11(uVar35,uVar33);
      uVar32 = CONCAT21(uVar34,uVar31);
      uVar64._4_4_ = CONCAT31(uVar32,uVar30);
      m_1.c = (int)uVar64;
      m_1.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.refcount._4_4_ = (float)((ulong)opt->workspace_allocator >> 0x20);
      m_1.elempack = uVar14;
      m_1._28_4_ = uVar16;
      m_1.h = uVar22;
      m_1.d = uVar24;
      m_1._60_4_ = uVar64._4_4_;
      convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    }
    iVar36 = Padding::forward((Padding *)
                              ((long)&this->_vptr_Padding_x86_avx +
                              (long)this->_vptr_Padding_x86_avx[-3]),&m,top_blob,opt);
    piVar10 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar36;
}

Assistant:

int Padding_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}